

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::show_losses(Graph *this,double powerLoss,double minTension,int idLoad)

{
  pointer pLVar1;
  double *pdVar2;
  
  if (idLoad == -1) {
    pdVar2 = getTotalLoss(this);
    printf(" Total \t\t|  %9.6f \t| \t%9.2f US$ \t|\t  -  \n",powerLoss,pdVar2[1]);
  }
  else {
    pLVar1 = (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
             super__Vector_impl_data._M_start;
    printf(" %1.2f \t\t|  %9.6f \t| \t%9.2f US$ \t|\t %.6f \n",pLVar1[idLoad].level,powerLoss,
           (double)pLVar1[idLoad].time * powerLoss * pLVar1[idLoad].cost,SUB84(minTension,0));
  }
  puts("--------------------------------------------------------------------");
  return;
}

Assistant:

void Graph::show_losses( double powerLoss, double minTension, int idLoad ){

    if(idLoad == -1) {
        double total_time = 0.0;
        for(int i = 0; i < 3; i++)
            total_time += this->loads[i].time;
        printf(" Total \t\t|  %9.6f \t| \t%9.2f US$ \t|\t  -  \n", powerLoss, this->getTotalLoss()[1]  );
    }
    else {
        double effective_loss = powerLoss * this->loads[idLoad].time;
        double loss_cost = effective_loss * this->loads[idLoad].cost;
        printf(" %1.2f \t\t|  %9.6f \t| \t%9.2f US$ \t|\t %.6f \n", this->loads[idLoad].level, powerLoss, loss_cost, minTension);
    }
    printf("--------------------------------------------------------------------\n");
}